

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

FunctionBody * __thiscall
Js::ParseableFunctionInfo::ParseAsmJs
          (ParseableFunctionInfo *this,Parser *ps,CompileScriptException *se,
          ParseNodeProg **parseTree)

{
  undefined1 *puVar1;
  Type TVar2;
  byte bVar3;
  uint uFunctionNumber;
  uint uScriptId;
  uint uVar4;
  NestedArray *pNVar5;
  SourceContextInfo *pSVar6;
  Type TVar7;
  code *pcVar8;
  char16_t *pcVar9;
  HRESULT HVar10;
  bool bVar11;
  BOOL BVar12;
  LocalFunctionId functionId;
  Attributes AVar13;
  int iVar14;
  HRESULT HVar15;
  undefined4 *puVar16;
  FunctionBody *other;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Utf8SourceInfo *pUVar17;
  LPCUTF8 pSrc;
  FunctionBody *pFVar18;
  ulong uVar19;
  Type nestedCount;
  HRESULT local_54;
  LocalFunctionId local_50;
  Type local_4c;
  uint nextFunctionId;
  char16_t *local_40;
  ulong local_38;
  
  BVar12 = FunctionProxy::IsDeferredParseFunction(&this->super_FunctionProxy);
  if (BVar12 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar16 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa36,"(IsDeferredParseFunction())","IsDeferredParseFunction()");
    if (!bVar11) goto LAB_006cb079;
    *puVar16 = 0;
  }
  if (((this->super_FunctionProxy).field_0x46 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar16 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa37,"(m_isAsmjsMode)","m_isAsmjsMode");
    if (!bVar11) goto LAB_006cb079;
    *puVar16 = 0;
  }
  _nextFunctionId = (this->super_FunctionProxy).m_scriptContext;
  local_40 = (this->m_displayName).ptr;
  local_38 = CONCAT44(local_38._4_4_,this->m_displayNameLength);
  local_4c = this->m_displayShortNameOffset;
  pNVar5 = (this->nestedArray).ptr;
  if (pNVar5 == (NestedArray *)0x0) {
    nestedCount = 0;
  }
  else {
    nestedCount = pNVar5->nestedCount;
  }
  pUVar17 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
  uFunctionNumber = (this->super_FunctionProxy).m_functionNumber;
  uScriptId = ((((pUVar17->m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  functionId = FunctionProxy::GetLocalFunctionId(&this->super_FunctionProxy);
  AVar13 = FunctionProxy::GetAttributes(&this->super_FunctionProxy);
  other = FunctionBody::NewFromRecycler
                    (_nextFunctionId,local_40,(uint)local_38,local_4c,nestedCount,pUVar17,
                     uFunctionNumber,uScriptId,functionId,
                     AVar13 & ~(DeferredParse|DeferredDeserialize),Flags_HasNoExplicitReturnValue);
  Copy(this,other);
  pSVar6 = (((((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo
           ).ptr;
  TVar7 = pSVar6->dwHostSourceContext;
  TVar2 = pSVar6->isHostDynamicDocument;
  bVar11 = Phases::IsEnabled((Phases *)&DAT_014594b0,DeferParsePhase);
  if ((TVar7 == 0xffffffffffffffff) || ((TVar2 & 1U) != 0)) {
    if (bVar11) {
      uVar4 = (this->super_FunctionProxy).m_functionNumber;
      iVar14 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[7])(this);
      pNVar5 = (this->nestedArray).ptr;
      if (pNVar5 == (NestedArray *)0x0) {
        uVar19 = 0;
      }
      else {
        uVar19 = (ulong)pNVar5->nestedCount;
      }
      pUVar17 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
      pcVar9 = L"LdTrue";
      if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
        pcVar9 = L"LdFalse";
      }
      Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"
                    ,(ulong)uVar4,CONCAT44(extraout_var_00,iVar14),(ulong)this->m_cchLength,uVar19,
                    (ulong)pUVar17->m_sourceInfoId,(ulong)pUVar17->m_cchLength,pcVar9 + 2);
      goto LAB_006cad8c;
    }
  }
  else if (bVar11) {
    uVar4 = (this->super_FunctionProxy).m_functionNumber;
    iVar14 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[7])(this);
    pNVar5 = (this->nestedArray).ptr;
    if (pNVar5 == (NestedArray *)0x0) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)pNVar5->nestedCount;
    }
    pUVar17 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
    pcVar9 = L"LdTrue";
    if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
      pcVar9 = L"LdFalse";
    }
    Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"
                  ,(ulong)uVar4,CONCAT44(extraout_var,iVar14),(ulong)this->m_cchLength,uVar19,
                  (ulong)pUVar17->m_sourceInfoId,(ulong)pUVar17->m_cchLength,pcVar9 + 2,
                  (((((pUVar17->m_srcInfo).ptr)->sourceContextInfo).ptr)->field_5).field_0.url);
LAB_006cad8c:
    Output::Flush();
  }
  if ((other->field_0x179 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar16 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa5a,"(!funcBody->HasExecutionDynamicProfileInfo())",
                                 "!funcBody->HasExecutionDynamicProfileInfo()");
    if (!bVar11) goto LAB_006cb079;
    *puVar16 = 0;
  }
  pUVar17 = ScriptContext::GetSource
                      ((this->super_FunctionProxy).m_scriptContext,
                       (other->super_ParseableFunctionInfo).m_sourceIndex);
  bVar3 = pUVar17->field_0xa8;
  _nextFunctionId = (Type)(ulong)this->m_cbStartOffset;
  local_40 = (char16_t *)CONCAT44(local_40._4_4_,this->m_cchStartOffset);
  local_38 = (ulong)this->m_cbLength;
  pSrc = GetStartOfDocument(this,(char16 *)0x0);
  uVar4 = (other->super_ParseableFunctionInfo).m_grfscr;
  local_50 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)other);
  local_54 = Parser::ParseSourceWithOffset
                       (ps,parseTree,pSrc,(size_t)_nextFunctionId,local_38,(charcount_t)local_40,
                        (bool)((bVar3 & 2) >> 1),uVar4 | 0x1800000,se,&local_50,
                        (other->super_ParseableFunctionInfo).m_lineNumber,
                        (((((other->super_ParseableFunctionInfo).super_FunctionProxy.
                            m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo).ptr,
                        &other->super_ParseableFunctionInfo);
  if (-1 < local_54) {
    if ((other->super_ParseableFunctionInfo).deferredParseNextFunctionId != local_50) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar16 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0xa71,
                                   "(((HRESULT)(hrParser)<0) || funcBody->deferredParseNextFunctionId == nextFunctionId)"
                                   ,
                                   "FAILED(hrParser) || funcBody->deferredParseNextFunctionId == nextFunctionId"
                                  );
      if (!bVar11) goto LAB_006cb079;
      *puVar16 = 0;
    }
LAB_006caf86:
    FunctionProxy::UpdateFunctionBodyImpl(&this->super_FunctionProxy,other);
    puVar1 = &(this->super_FunctionProxy).field_0x45;
    *puVar1 = *puVar1 | 2;
    pFVar18 = FunctionProxy::GetFunctionBody((FunctionProxy *)other);
    if (pFVar18 != other) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar16 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0xa8c,"(funcBody->GetFunctionBody() == funcBody)",
                                   "funcBody->GetFunctionBody() == funcBody");
      if (!bVar11) {
LAB_006cb079:
        pcVar8 = (code *)invalidInstructionException();
        (*pcVar8)();
      }
      *puVar16 = 0;
    }
    return other;
  }
  HVar15 = MapDeferredReparseError(&local_54,se);
  HVar10 = local_54;
  if (-1 < HVar15 || local_54 < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar16 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa75,
                                 "(((HRESULT)(hrParseCodeGen)<0) && ((HRESULT)(hrParser) >= 0))",
                                 "Syntax errors should never be detected on deferred re-parse");
    if (!bVar11) goto LAB_006cb079;
    *puVar16 = 0;
    if (HVar10 < 0) {
      Throw::InternalError();
    }
    if (-1 < HVar15) goto LAB_006caf86;
  }
  if (HVar15 != -0x7ff8fff2) {
    if (HVar15 == -0x7ff5ffe4) {
      Throw::StackOverflow((this->super_FunctionProxy).m_scriptContext,(PVOID)0x0);
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar16 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa84,"(hrParseCodeGen == ((HRESULT)0x8007000EL))",
                                 "hrParseCodeGen == E_OUTOFMEMORY");
    if (!bVar11) goto LAB_006cb079;
    *puVar16 = 0;
  }
  Throw::OutOfMemory();
}

Assistant:

FunctionBody* ParseableFunctionInfo::ParseAsmJs(Parser * ps, __out CompileScriptException * se, __out ParseNodeProg ** parseTree)
    {
        Assert(IsDeferredParseFunction());
        Assert(m_isAsmjsMode);

        FunctionBody* returnFunctionBody = nullptr;
        FunctionBody* funcBody = nullptr;

        funcBody = FunctionBody::NewFromRecycler(
            this->m_scriptContext,
            this->m_displayName,
            this->m_displayNameLength,
            this->m_displayShortNameOffset,
            this->GetNestedCount(),
            this->GetUtf8SourceInfo(),
            this->m_functionNumber,
            this->GetUtf8SourceInfo()->GetSrcInfo()->sourceContextInfo->sourceContextId,
            this->GetLocalFunctionId(),
            (FunctionInfo::Attributes)(this->GetAttributes() & ~(FunctionInfo::Attributes::DeferredDeserialize | FunctionInfo::Attributes::DeferredParse)),
            Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue
#ifdef PERF_COUNTERS
            , false /* is function from deferred deserialized proxy */
#endif
            );

        this->Copy(funcBody);
        PERF_COUNTER_DEC(Code, DeferredFunction);

        if (!this->GetSourceContextInfo()->IsDynamic())
        {
            PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(), this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"), this->GetSourceContextInfo()->url);
        }
        else
        {
            PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(), this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"));
        }

#if ENABLE_PROFILE_INFO
        Assert(!funcBody->HasExecutionDynamicProfileInfo());
#endif

        HRESULT hrParser = NO_ERROR;
        HRESULT hrParseCodeGen = NO_ERROR;

        bool isCesu8 = m_scriptContext->GetSource(funcBody->GetSourceIndex())->IsCesu8();

        size_t offset = this->StartOffset();
        charcount_t charOffset = this->StartInDocument();
        size_t length = this->LengthInBytes();

        LPCUTF8 pszStart = this->GetStartOfDocument();

        uint32 grfscr = funcBody->GetGrfscr() | fscrDeferredFnc | fscrDeferredFncExpression;

        uint nextFunctionId = funcBody->GetLocalFunctionId();

        // if parser throws, it will be caught by function trying to bytecode gen the asm.js module, so don't need to catch/rethrow here
        hrParser = ps->ParseSourceWithOffset(parseTree, pszStart, offset, length, charOffset, isCesu8, grfscr, se,
                    &nextFunctionId, funcBody->GetRelativeLineNumber(), funcBody->GetSourceContextInfo(),
                    funcBody);

        Assert(FAILED(hrParser) || funcBody->deferredParseNextFunctionId == nextFunctionId);
        if (FAILED(hrParser))
        {
            hrParseCodeGen = MapDeferredReparseError(hrParser, *se); // Map certain errors like OOM/SOE
            AssertMsg(FAILED(hrParseCodeGen) && SUCCEEDED(hrParser), "Syntax errors should never be detected on deferred re-parse");
        }

        if (!SUCCEEDED(hrParser))
        {
            Throw::InternalError();
        }
        else if (!SUCCEEDED(hrParseCodeGen))
        {
            if (hrParseCodeGen == VBSERR_OutOfStack)
            {
                Throw::StackOverflow(m_scriptContext, nullptr);
            }
            else
            {
                Assert(hrParseCodeGen == E_OUTOFMEMORY);
                Throw::OutOfMemory();
            }
        }

        UpdateFunctionBodyImpl(funcBody);
        m_hasBeenParsed = true;

        Assert(funcBody->GetFunctionBody() == funcBody);

        returnFunctionBody = funcBody;

        return returnFunctionBody;
    }